

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflatmap_p.h
# Opt level: O2

ButtonRole __thiscall
QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
::take(QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
       *this,QAbstractButton **key)

{
  ButtonRole BVar1;
  iterator it;
  
  it = find(this,key);
  BVar1 = do_take(this,it);
  return BVar1;
}

Assistant:

T take(const Key &key)
    {
        return do_take(find(key));
    }